

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_utils.hpp
# Opt level: O0

int parse_utils::parse_memory(string *memory)

{
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  string *local_10;
  string *memory_local;
  
  local_10 = memory;
  pcVar2 = (char *)std::__cxx11::string::back();
  if (*pcVar2 != 'm') {
    std::operator+(&local_30,"error flag memory: ",memory);
    poVar3 = std::operator<<((ostream *)&std::cerr,(string *)&local_30);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_30);
    poVar3 = std::operator<<((ostream *)&std::cerr,"please use flag \'--memory 10m\' ");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(-1);
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::string((string *)&local_60,(string *)memory);
  iVar1 = obj_utils::string_to_int(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  return iVar1 << 0x14;
}

Assistant:

static int parse_memory(std::string memory) {
    if (memory.back() != 'm') {
      std::cerr << "error flag memory: " + memory << std::endl;
      std::cerr << "please use flag '--memory 10m' " << std::endl;
      exit(-1);
    }
    memory.pop_back();
    return obj_utils::string_to_int(memory) << 20;
  }